

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_data_checkpointer.cpp
# Opt level: O2

CompressionType
duckdb::ForceCompression
          (vector<duckdb::optional_ptr<duckdb::CompressionFunction,_true>,_true>
           *compression_functions,CompressionType compression_type)

{
  reference pvVar1;
  CompressionFunction *pCVar2;
  idx_t i;
  ulong uVar3;
  
  uVar3 = 0;
  do {
    if ((ulong)((long)(compression_functions->
                      super_vector<duckdb::optional_ptr<duckdb::CompressionFunction,_true>,_std::allocator<duckdb::optional_ptr<duckdb::CompressionFunction,_true>_>_>
                      ).
                      super__Vector_base<duckdb::optional_ptr<duckdb::CompressionFunction,_true>,_std::allocator<duckdb::optional_ptr<duckdb::CompressionFunction,_true>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(compression_functions->
                      super_vector<duckdb::optional_ptr<duckdb::CompressionFunction,_true>,_std::allocator<duckdb::optional_ptr<duckdb::CompressionFunction,_true>_>_>
                      ).
                      super__Vector_base<duckdb::optional_ptr<duckdb::CompressionFunction,_true>,_std::allocator<duckdb::optional_ptr<duckdb::CompressionFunction,_true>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) <= uVar3) {
      return COMPRESSION_AUTO;
    }
    pvVar1 = vector<duckdb::optional_ptr<duckdb::CompressionFunction,_true>,_true>::get<true>
                       (compression_functions,uVar3);
    pCVar2 = optional_ptr<duckdb::CompressionFunction,_true>::operator*(pvVar1);
    uVar3 = uVar3 + 1;
  } while (pCVar2->type != compression_type);
  for (uVar3 = 0;
      uVar3 < (ulong)((long)(compression_functions->
                            super_vector<duckdb::optional_ptr<duckdb::CompressionFunction,_true>,_std::allocator<duckdb::optional_ptr<duckdb::CompressionFunction,_true>_>_>
                            ).
                            super__Vector_base<duckdb::optional_ptr<duckdb::CompressionFunction,_true>,_std::allocator<duckdb::optional_ptr<duckdb::CompressionFunction,_true>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(compression_functions->
                            super_vector<duckdb::optional_ptr<duckdb::CompressionFunction,_true>,_std::allocator<duckdb::optional_ptr<duckdb::CompressionFunction,_true>_>_>
                            ).
                            super__Vector_base<duckdb::optional_ptr<duckdb::CompressionFunction,_true>,_std::allocator<duckdb::optional_ptr<duckdb::CompressionFunction,_true>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3); uVar3 = uVar3 + 1) {
    pvVar1 = vector<duckdb::optional_ptr<duckdb::CompressionFunction,_true>,_true>::get<true>
                       (compression_functions,uVar3);
    pCVar2 = optional_ptr<duckdb::CompressionFunction,_true>::operator*(pvVar1);
    if (pCVar2->type != compression_type && pCVar2->type != COMPRESSION_UNCOMPRESSED) {
      pvVar1 = vector<duckdb::optional_ptr<duckdb::CompressionFunction,_true>,_true>::get<true>
                         (compression_functions,uVar3);
      pvVar1->ptr = (CompressionFunction *)0x0;
    }
  }
  return compression_type;
}

Assistant:

CompressionType ForceCompression(vector<optional_ptr<CompressionFunction>> &compression_functions,
                                 CompressionType compression_type) {
// On of the force_compression flags has been set
// check if this compression method is available
#ifdef DEBUG
	if (CompressionTypeIsDeprecated(compression_type)) {
		throw InternalException("Deprecated compression type: %s", CompressionTypeToString(compression_type));
	}
#endif
	bool found = false;
	for (idx_t i = 0; i < compression_functions.size(); i++) {
		auto &compression_function = *compression_functions[i];
		if (compression_function.type == compression_type) {
			found = true;
			break;
		}
	}
	if (!found) {
		return CompressionType::COMPRESSION_AUTO;
	}
	// the force_compression method is available
	// clear all other compression methods
	// except the uncompressed method, so we can fall back on that
	for (idx_t i = 0; i < compression_functions.size(); i++) {
		auto &compression_function = *compression_functions[i];
		if (compression_function.type == CompressionType::COMPRESSION_UNCOMPRESSED) {
			continue;
		}
		if (compression_function.type != compression_type) {
			compression_functions[i] = nullptr;
		}
	}
	return compression_type;
}